

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void bc_trie_size_node(bc_trie_node_t *node,size_t *count)

{
  if (node != (bc_trie_node_t *)0x0 && count != (size_t *)0x0) {
    do {
      if (node->key == '\0') {
        *count = *count + 1;
      }
      bc_trie_size_node(node->next,count);
      node = node->child;
    } while (node != (_bc_trie_node_t *)0x0);
  }
  return;
}

Assistant:

static void
bc_trie_size_node(bc_trie_node_t *node, size_t *count)
{
    if (node == NULL || count == NULL)
        return;

    if (node->key == '\0')
        (*count)++;

    bc_trie_size_node(node->next, count);
    bc_trie_size_node(node->child, count);
}